

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rldata.hpp
# Opt level: O0

string * __thiscall
relive::ChatMessage::nick_abi_cxx11_(string *__return_storage_ptr__,ChatMessage *this)

{
  bool bVar1;
  const_reference pvVar2;
  char *pcVar3;
  long lVar4;
  ChatMessage *this_local;
  value_type *result;
  
  bVar1 = hasNick(this);
  if (bVar1) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::front(&this->_strings);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pvVar2);
    std::__cxx11::string::length();
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
    if (*pcVar3 == '@') {
      lVar4 = std::__cxx11::string::length();
      std::__cxx11::string::erase((ulong)__return_storage_ptr__,lVar4 - 1);
    }
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string nick() const {
        if(!hasNick()) {
            return std::string();
        }
        auto result = _strings.front();
        if(result[result.length()-1] == '@') {
            result.erase(result.length()-1);
        }
        return result;
    }